

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

FOTerm * test_create_program(void)

{
  undefined1 auVar1 [16];
  FOTerm *in_RDI;
  ulong in_R8;
  long lVar2;
  initializer_list<FOTerm> params;
  initializer_list<FOTerm> params_00;
  initializer_list<FOTerm> params_01;
  initializer_list<FOTerm> params_02;
  undefined1 local_348 [8];
  FOTerm X;
  FOTerm a;
  FOTerm fa;
  FOTerm Y;
  FOTerm fX;
  FOTerm hYfa;
  string local_108;
  string local_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [71];
  allocator local_21;
  
  std::__cxx11::string::string
            ((string *)&local_108,"X",(allocator *)(hYfa.name.field_2._M_local_buf + 8));
  FOTerm::variable((FOTerm *)local_348,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string
            ((string *)&local_e8,"Y",(allocator *)(hYfa.name.field_2._M_local_buf + 8));
  FOTerm::variable((FOTerm *)((long)&fa.name.field_2 + 8),&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::string
            ((string *)local_c8,"a",(allocator *)(hYfa.name.field_2._M_local_buf + 8));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_R8;
  FOTerm::functor((FOTerm *)((long)&X.name.field_2 + 8),(FOTerm *)local_c8,(string *)0x0,
                  (initializer_list<FOTerm>)(auVar1 << 0x40));
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string
            ((string *)local_a8,"f",(allocator *)(Y.name.field_2._M_local_buf + 8));
  FOTerm::FOTerm((FOTerm *)((long)&hYfa.name.field_2 + 8),(FOTerm *)((long)&X.name.field_2 + 8));
  params._M_len = in_R8;
  params._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)((long)&a.name.field_2 + 8),(FOTerm *)local_a8,
                  (string *)((long)&hYfa.name.field_2 + 8),params);
  FOTerm::~FOTerm((FOTerm *)((long)&hYfa.name.field_2 + 8));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::string
            ((string *)local_88,"f",(allocator *)(fX.name.field_2._M_local_buf + 8));
  FOTerm::FOTerm((FOTerm *)((long)&hYfa.name.field_2 + 8),(FOTerm *)local_348);
  params_00._M_len = in_R8;
  params_00._M_array = (iterator)0x1;
  FOTerm::functor((FOTerm *)((long)&Y.name.field_2 + 8),(FOTerm *)local_88,
                  (string *)((long)&hYfa.name.field_2 + 8),params_00);
  FOTerm::~FOTerm((FOTerm *)((long)&hYfa.name.field_2 + 8));
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::string((string *)local_68,"h",&local_21);
  FOTerm::FOTerm((FOTerm *)((long)&hYfa.name.field_2 + 8),(FOTerm *)((long)&fa.name.field_2 + 8));
  FOTerm::FOTerm((FOTerm *)&stack0xfffffffffffffe78,(FOTerm *)((long)&a.name.field_2 + 8));
  params_01._M_len = in_R8;
  params_01._M_array = (iterator)0x2;
  FOTerm::functor((FOTerm *)((long)&fX.name.field_2 + 8),(FOTerm *)local_68,
                  (string *)((long)&hYfa.name.field_2 + 8),params_01);
  lVar2 = 0x40;
  do {
    FOTerm::~FOTerm((FOTerm *)((long)&hYfa.name.field_2 + lVar2 + 8));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::string((string *)(local_68 + 0x20),"p",&local_21);
  FOTerm::FOTerm((FOTerm *)((long)&hYfa.name.field_2 + 8),(FOTerm *)((long)&Y.name.field_2 + 8));
  FOTerm::FOTerm((FOTerm *)&stack0xfffffffffffffe78,(FOTerm *)((long)&fX.name.field_2 + 8));
  FOTerm::FOTerm((FOTerm *)&stack0xfffffffffffffeb8,(FOTerm *)((long)&fa.name.field_2 + 8));
  params_02._M_len = in_R8;
  params_02._M_array = (iterator)0x3;
  FOTerm::functor(in_RDI,(FOTerm *)(local_68 + 0x20),(string *)((long)&hYfa.name.field_2 + 8),
                  params_02);
  lVar2 = 0x80;
  do {
    FOTerm::~FOTerm((FOTerm *)((long)&hYfa.name.field_2 + lVar2 + 8));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  FOTerm::~FOTerm((FOTerm *)((long)&fX.name.field_2 + 8));
  FOTerm::~FOTerm((FOTerm *)((long)&Y.name.field_2 + 8));
  FOTerm::~FOTerm((FOTerm *)((long)&a.name.field_2 + 8));
  FOTerm::~FOTerm((FOTerm *)((long)&X.name.field_2 + 8));
  FOTerm::~FOTerm((FOTerm *)((long)&fa.name.field_2 + 8));
  FOTerm::~FOTerm((FOTerm *)local_348);
  return in_RDI;
}

Assistant:

FOTerm test_create_program() {
    FOTerm X = FOTerm::variable("X");
    FOTerm Y = FOTerm::variable("Y");
    FOTerm a = FOTerm::functor("a", {});
    FOTerm fa = FOTerm::functor("f", {a});
    FOTerm fX = FOTerm::functor("f", {X});
    FOTerm hYfa = FOTerm::functor("h", {Y, fa});
    return FOTerm::functor("p", {fX, hYfa, Y});
}